

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O1

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
::next_semiintersection
          (semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
           *this)

{
  char cVar1;
  iterator_range<std::_List_iterator<char>_> *piVar2;
  size_t sVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  outer_range_iterator oVar6;
  
  do {
    oVar6._M_current = (this->m_begin)._M_current;
    if (oVar6._M_current == (this->m_end)._M_current) {
      return;
    }
    oVar6 = skip_while_less(this,oVar6,oVar6._M_current + (this->m_min_items - 1));
    piVar2 = (this->m_begin)._M_current;
    sVar3 = this->m_min_items;
    p_Var4 = ((oVar6._M_current)->
             super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
             ).
             super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
             .m_Begin._M_node;
    p_Var5 = ((oVar6._M_current)->
             super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
             ).
             super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
             .m_End._M_node;
    if (oVar6._M_current == piVar2 + (sVar3 - 1)) {
      if ((p_Var4 == p_Var5) ||
         (p_Var5 = piVar2[sVar3 - 1].
                   super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                   .m_Begin._M_node,
         p_Var5 == piVar2[sVar3 - 1].
                   super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                   .m_End._M_node)) {
LAB_0024b50b:
        __assert_fail("!empty()","/usr/include/boost/range/iterator_range_core.hpp",0xff,
                      "reference boost::iterator_range_detail::iterator_range_base<std::_List_iterator<char>, boost::iterators::incrementable_traversal_tag>::front() const [IteratorT = std::_List_iterator<char>, TraversalTag = boost::iterators::incrementable_traversal_tag]"
                     );
      }
      cVar1 = *(char *)&p_Var5[1]._M_next;
      if (cVar1 < *(char *)&p_Var4[1]._M_next) {
        __assert_fail("not m_compare(skipped_until->front(), semiintersection_candidate()->front())"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                      ,0xf9,
                      "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, std::greater<void>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, Compare = std::greater<void>]"
                     );
      }
      if (*(char *)&p_Var4[1]._M_next < cVar1) {
        __assert_fail("not m_compare(semiintersection_candidate()->front(), skipped_until->front())"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                      ,0xfa,
                      "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, std::greater<void>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, Compare = std::greater<void>]"
                     );
      }
    }
    else if (p_Var4 == p_Var5) {
      drop_empty_range(this,oVar6);
    }
    else {
      p_Var5 = piVar2[sVar3 - 1].
               super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin._M_node;
      if (p_Var5 == piVar2[sVar3 - 1].
                    super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
                    .
                    super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                    .m_End._M_node) goto LAB_0024b50b;
      if (*(char *)&p_Var5[1]._M_next <= *(char *)&p_Var4[1]._M_next) {
        __assert_fail("m_compare(semiintersection_candidate()->front(), skipped_until->front())",
                      "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                      ,0x103,
                      "void burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, std::greater<void>>::next_semiintersection() [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>> *, std::vector<boost::iterator_range<std::_List_iterator<char>>>>, Compare = std::greater<void>]"
                     );
      }
      maintain_invariant(this);
    }
    if (oVar6._M_current == piVar2 + (sVar3 - 1)) {
      return;
    }
  } while( true );
}

Assistant:

void next_semiintersection ()
        {
            while (not is_end())
            {
                auto skipped_until = skip_while_less(m_begin, semiintersection_candidate());
                if (skipped_until == semiintersection_candidate())
                {
                    BOOST_ASSERT(not m_compare(skipped_until->front(), semiintersection_candidate()->front()));
                    BOOST_ASSERT(not m_compare(semiintersection_candidate()->front(), skipped_until->front()));
                    break; // Полупересечение найдено.
                }
                else if (skipped_until->empty())
                {
                    drop_empty_range(skipped_until);
                }
                else // Текущий диапазон больше кандидата.
                {
                    BOOST_ASSERT(m_compare(semiintersection_candidate()->front(), skipped_until->front()));
                    maintain_invariant();
                }
            }
        }